

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O0

void cipher_freectx(void *vgctx)

{
  void *in_RDI;
  GOST_CTX *gctx;
  
  EVP_CIPHER_CTX_free(*(EVP_CIPHER_CTX **)((long)in_RDI + 0x20));
  CRYPTO_free(in_RDI);
  return;
}

Assistant:

static void cipher_freectx(void *vgctx)
{
    GOST_CTX *gctx = vgctx;

    /*
     * We don't free gctx->cipher here.
     * That will be done by the provider teardown, via
     * GOST_prov_deinit_ciphers() (defined at the bottom of this file).
     */
    EVP_CIPHER_CTX_free(gctx->cctx);
    OPENSSL_free(gctx);
}